

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O0

int dw_read_str_index_val_itself
              (Dwarf_Debug dbg,uint theform,Dwarf_Small *info_ptr,Dwarf_Small *section_end,
              Dwarf_Unsigned *return_index,Dwarf_Error *error)

{
  Dwarf_Byte_Ptr readend_3;
  Dwarf_Unsigned _ltmp_3;
  Dwarf_Byte_Ptr readend_2;
  Dwarf_Unsigned _ltmp_2;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned DStack_58;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Unsigned index;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *return_index_local;
  Dwarf_Small *section_end_local;
  Dwarf_Small *info_ptr_local;
  Dwarf_Debug pDStack_18;
  uint theform_local;
  Dwarf_Debug dbg_local;
  
  lu_leblen = 0;
  index = (Dwarf_Unsigned)error;
  error_local = (Dwarf_Error *)return_index;
  return_index_local = (Dwarf_Unsigned *)section_end;
  section_end_local = info_ptr;
  info_ptr_local._4_4_ = theform;
  pDStack_18 = dbg;
  if (theform != 0x1a) {
    if (theform == 0x25) {
      readend = (Dwarf_Byte_Ptr)0x0;
      _ltmp_1 = (Dwarf_Unsigned)(info_ptr + 1);
      if (_ltmp_1 < info_ptr) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (section_end < _ltmp_1) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (*dbg->de_copy_word)(&readend,info_ptr,1);
      lu_leblen = (Dwarf_Unsigned)readend;
      goto LAB_002d8292;
    }
    if (theform == 0x26) {
      readend_1 = (Dwarf_Byte_Ptr)0x0;
      _ltmp_2 = (Dwarf_Unsigned)(info_ptr + 2);
      if (_ltmp_2 < info_ptr) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (section_end < _ltmp_2) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (*dbg->de_copy_word)(&readend_1,info_ptr,2);
      lu_leblen = (Dwarf_Unsigned)readend_1;
      goto LAB_002d8292;
    }
    if (theform == 0x27) {
      readend_2 = (Dwarf_Byte_Ptr)0x0;
      _ltmp_3 = (Dwarf_Unsigned)(info_ptr + 3);
      if (_ltmp_3 < info_ptr) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (section_end < _ltmp_3) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (*dbg->de_copy_word)(&readend_2,info_ptr,3);
      lu_leblen = (Dwarf_Unsigned)readend_2;
      goto LAB_002d8292;
    }
    if (theform == 0x28) {
      readend_3 = (Dwarf_Byte_Ptr)0x0;
      if (info_ptr + 4 < info_ptr) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (section_end < info_ptr + 4) {
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (*dbg->de_copy_word)(&readend_3,info_ptr,4);
      lu_leblen = (Dwarf_Unsigned)readend_3;
      goto LAB_002d8292;
    }
    if (theform != 0x1f02) {
      _dwarf_error(dbg,error,0x103);
      return 1;
    }
  }
  lu_local = 0;
  DStack_58 = 0;
  _ltmp._4_4_ = 0;
  _ltmp._4_4_ = dwarf_decode_leb128((char *)info_ptr,&lu_local,&stack0xffffffffffffffa8,
                                    (char *)section_end);
  if (_ltmp._4_4_ == 1) {
    _dwarf_error_string(pDStack_18,(Dwarf_Error *)index,0x149,
                        "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
    return 1;
  }
  lu_leblen = DStack_58;
LAB_002d8292:
  *error_local = (Dwarf_Error)lu_leblen;
  return 0;
}

Assistant:

static int
dw_read_str_index_val_itself(Dwarf_Debug dbg,
    unsigned theform,
    Dwarf_Small *info_ptr,
    Dwarf_Small *section_end,
    Dwarf_Unsigned *return_index,
    Dwarf_Error *error)
{
    Dwarf_Unsigned index = 0;

    switch(theform) {
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
        DECODE_LEB128_UWORD_CK(info_ptr,index,
            dbg,error,section_end);
        break;
    case DW_FORM_strx1:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 1,
            error,section_end);
        break;
    case DW_FORM_strx2:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 2,
            error,section_end);
        break;
    case DW_FORM_strx3:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 3,
            error,section_end);
        break;
    case DW_FORM_strx4:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 4,
            error,section_end);
        break;
    default:
        _dwarf_error(dbg, error, DW_DLE_ATTR_FORM_NOT_STR_INDEX);
        return DW_DLV_ERROR;
    }
    *return_index = index;
    return DW_DLV_OK;
}